

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

void unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,
                    unsigned_short *toLim)

{
  unsigned_short uVar1;
  char **ppcVar3;
  unsigned_short *puVar4;
  byte *pbVar5;
  int iVar2;
  
  pbVar5 = (byte *)*fromP;
  if (pbVar5 != (byte *)fromLim) {
    ppcVar3 = (char **)*toP;
    puVar4 = (unsigned_short *)fromLim;
    do {
      if (ppcVar3 == (char **)toLim) {
        return;
      }
      uVar1 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)*pbVar5 * 2 + 0x18);
      if (uVar1 == 0) {
        iVar2 = (*enc[3].literalScanners[1])
                          ((ENCODING *)enc[3].sameName,(char *)pbVar5,(char *)puVar4,ppcVar3);
        uVar1 = (unsigned_short)iVar2;
        pbVar5 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) -
                                   3));
      }
      else {
        pbVar5 = pbVar5 + 1;
      }
      *fromP = (char *)pbVar5;
      puVar4 = *toP;
      ppcVar3 = (char **)(puVar4 + 1);
      *toP = (unsigned_short *)ppcVar3;
      *puVar4 = uVar1;
      pbVar5 = (byte *)*fromP;
    } while (pbVar5 != (byte *)fromLim);
  }
  return;
}

Assistant:

static
void unknown_toUtf16(const ENCODING *enc,
                     const char **fromP, const char *fromLim,
                     unsigned short **toP, const unsigned short *toLim)
{
  while (*fromP != fromLim && *toP != toLim) {
    unsigned short c
      = ((const struct unknown_encoding *)enc)->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)((const struct unknown_encoding *)enc)
           ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }
}